

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_identifier_t::Generate(ast_identifier_t *this,ostream *output,int pc)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(output,"rval ");
  poVar1 = std::operator<<(poVar1,(string *)&this->value);
  std::endl<char,std::char_traits<char>>(poVar1);
  return pc + 1;
}

Assistant:

int ast_identifier_t::Generate(std::ostream& output, int pc) const {
    output << "rval " << this->value << std::endl; 
    return pc + 1;
  }